

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger.cpp
# Opt level: O2

void __thiscall Debugger::DoAction(Debugger *this,DebugAction action)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  shared_ptr<HookState> sStack_88;
  __shared_ptr<HookState,(__gnu_cxx::_Lock_policy)2> local_78 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  __shared_ptr<HookState,(__gnu_cxx::_Lock_policy)2> local_68 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<HookState,(__gnu_cxx::_Lock_policy)2> local_58 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<HookState,(__gnu_cxx::_Lock_policy)2> local_48 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  __shared_ptr<HookState,(__gnu_cxx::_Lock_policy)2> local_38 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  std::mutex::lock(&this->hookStateMtx);
  switch(action) {
  case Break:
    std::__shared_ptr<HookState,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<HookStateBreak,void>
              (local_38,(__shared_ptr<HookStateBreak,_(__gnu_cxx::_Lock_policy)2> *)this->manager);
    SetHookState(this,(shared_ptr<HookState> *)local_38);
    this_00 = &local_30;
    break;
  case Continue:
    std::__shared_ptr<HookState,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<HookStateContinue,void>
              (local_48,&(this->manager->stateContinue).
                         super___shared_ptr<HookStateContinue,_(__gnu_cxx::_Lock_policy)2>);
    SetHookState(this,(shared_ptr<HookState> *)local_48);
    this_00 = &local_40;
    break;
  case StepOver:
    std::__shared_ptr<HookState,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<HookStateStepOver,void>
              (local_58,&(this->manager->stateStepOver).
                         super___shared_ptr<HookStateStepOver,_(__gnu_cxx::_Lock_policy)2>);
    SetHookState(this,(shared_ptr<HookState> *)local_58);
    this_00 = &local_50;
    break;
  case StepIn:
    std::__shared_ptr<HookState,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<HookStateStepIn,void>
              (local_68,&(this->manager->stateStepIn).
                         super___shared_ptr<HookStateStepIn,_(__gnu_cxx::_Lock_policy)2>);
    SetHookState(this,(shared_ptr<HookState> *)local_68);
    this_00 = &local_60;
    break;
  case StepOut:
    std::__shared_ptr<HookState,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<HookStateStepOut,void>
              ((__shared_ptr<HookState,(__gnu_cxx::_Lock_policy)2> *)&sStack_88,
               &(this->manager->stateStepOut).
                super___shared_ptr<HookStateStepOut,_(__gnu_cxx::_Lock_policy)2>);
    SetHookState(this,&sStack_88);
    this_00 = &sStack_88.super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    break;
  case Stop:
    std::__shared_ptr<HookState,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<HookStateStop,void>
              (local_78,&(this->manager->stateStop).
                         super___shared_ptr<HookStateStop,_(__gnu_cxx::_Lock_policy)2>);
    SetHookState(this,(shared_ptr<HookState> *)local_78);
    this_00 = &local_70;
    break;
  default:
    goto switchD_00156d9e_default;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_00);
switchD_00156d9e_default:
  pthread_mutex_unlock((pthread_mutex_t *)&this->hookStateMtx);
  return;
}

Assistant:

void Debugger::DoAction(DebugAction action) {
	// 锁加到这里
	std::lock_guard<std::mutex> lock(hookStateMtx);
	switch (action) {
		case DebugAction::Break:
			SetHookState(manager->stateBreak);
			break;
		case DebugAction::Continue:
			SetHookState(manager->stateContinue);
			break;
		case DebugAction::StepOver:
			SetHookState(manager->stateStepOver);
			break;
		case DebugAction::StepIn:
			SetHookState(manager->stateStepIn);
			break;
		case DebugAction::Stop:
			SetHookState(manager->stateStop);
			break;
		case DebugAction::StepOut:
			SetHookState(manager->stateStepOut);
			break;
		default:
			break;
	}
}